

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

QWidget * __thiscall QDataWidgetMapper::mappedWidgetAt(QDataWidgetMapper *this,int section)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  WidgetMapper *e;
  long *plVar3;
  
  pQVar2 = *(QWidget **)(this + 8);
  plVar3 = *(long **)(pQVar2 + 4);
  pQVar1 = pQVar2 + 4;
  while( true ) {
    if (plVar3 == *(long **)&pQVar1->field_0x8) {
      return (QWidget *)0x0;
    }
    if ((int)plVar3[2] == section) {
      if ((*plVar3 == 0) || (*(int *)(*plVar3 + 4) == 0)) {
        pQVar2 = (QWidget *)0x0;
      }
      else {
        pQVar2 = (QWidget *)plVar3[1];
      }
    }
    if ((int)plVar3[2] == section) break;
    plVar3 = plVar3 + 7;
  }
  return pQVar2;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }